

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgensubstruct.cpp
# Opt level: O1

void __thiscall TPZGenSubStruct::SubStructure(TPZGenSubStruct *this)

{
  TPZGeoMesh *this_00;
  TPZGeoEl *this_01;
  TPZCompMesh *mesh;
  TPZCompEl *pTVar1;
  int64_t iVar2;
  int iVar3;
  int iVar4;
  TPZGeoEl **ppTVar5;
  long lVar6;
  TPZSubCompMesh *this_02;
  TPZCompEl **ppTVar7;
  long *plVar8;
  TPZChunkVector<TPZGeoEl_*,_10> *this_03;
  int iVar9;
  ulong nelem;
  TPZCompEl *pTVar10;
  uint uVar11;
  ulong uVar12;
  bool bVar13;
  TPZCompElSide TVar14;
  TPZGeoElSide gelside;
  TPZSimpleTimer timeformakeallinternal;
  TPZCompElSide celside;
  TPZSimpleTimer timesubstructuring;
  string local_1b0;
  _func_int **local_190;
  TPZChunkVector<TPZGeoEl_*,_10> *local_188;
  ulong local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178;
  _func_int **local_170;
  undefined1 local_168 [32];
  TPZCompElSide local_148 [10];
  TPZGeoElSide local_a8;
  TPZSimpleTimer local_90;
  
  TPZSimpleTimer::TPZSimpleTimer(&local_90);
  this_00 = ((this->fCMesh).fRef)->fPointer->fReference;
  uVar11 = (uint)(this_00->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements;
  if (0 < (int)uVar11) {
    this_03 = &(this_00->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>;
    uVar12 = (ulong)(uVar11 & 0x7fffffff);
    nelem = 0;
    local_170 = (_func_int **)&PTR__TPZManVector_01842198;
    local_178 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&PTR__TPZGeoElSide_01920090;
    local_190 = (_func_int **)&PTR__TPZVec_0183b970;
    local_188 = this_03;
    local_180 = uVar12;
    do {
      ppTVar5 = TPZChunkVector<TPZGeoEl_*,_10>::operator[](this_03,nelem);
      this_01 = *ppTVar5;
      iVar3 = TPZGeoEl::Level(this_01);
      if (iVar3 == this->fSubstructLevel) {
        lVar6 = 0x28;
        do {
          *(undefined8 *)((long)&local_170 + lVar6) = 0;
          *(undefined4 *)(local_168 + lVar6) = 0xffffffff;
          lVar6 = lVar6 + 0x10;
        } while (lVar6 != 200);
        local_168._8_8_ = local_148;
        local_168._16_8_ = 0;
        local_168._24_8_ = 0;
        local_168._0_8_ = local_170;
        iVar3 = (**(code **)(*(long *)this_01 + 0xf0))(this_01);
        local_1b0.field_2._M_allocated_capacity._0_4_ = iVar3 + -1;
        local_1b0._M_dataplus._M_p = (pointer)local_178;
        local_1b0._M_string_length = (size_type)this_01;
        TPZGeoMesh::ResetReference(this_00);
        TPZCompMesh::LoadReferences(((this->fCMesh).fRef)->fPointer);
        TPZGeoElSide::HigherLevelCompElementList2
                  ((TPZGeoElSide *)&local_1b0,(TPZStack<TPZCompElSide,_10> *)local_168,0,0);
        uVar11 = local_168._16_4_;
        if (local_168._16_4_ == 0) {
          TVar14 = TPZGeoElSide::Reference((TPZGeoElSide *)&local_1b0);
          iVar3 = (int)local_a8.fGeoEl;
          pTVar10 = (TPZCompEl *)
                    CONCAT71(local_a8.super_TPZSavable._vptr_TPZSavable._1_7_,
                             local_a8.super_TPZSavable._vptr_TPZSavable._0_1_);
          if (pTVar10 == (TPZCompEl *)0x0) {
            uVar11 = 0;
          }
          else {
            (**(_func_int **)(local_168._0_8_ + 0x18))(local_168,local_168._16_8_ + 1,TVar14._8_8_);
            ((TPZCompElSide *)(local_168._8_8_ + (local_168._16_8_ - 1) * 0x10))->fEl = pTVar10;
            ((TPZCompElSide *)(local_168._8_8_ + (local_168._16_8_ - 1) * 0x10))->fSide = iVar3;
            uVar11 = 1;
          }
        }
        mesh = ((this->fCMesh).fRef)->fPointer;
        this_02 = (TPZSubCompMesh *)operator_new(0xa78);
        TPZSubCompMesh::TPZSubCompMesh(this_02,mesh);
        local_a8.super_TPZSavable._vptr_TPZSavable._0_1_ = 0x2a;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)&local_a8,1);
        std::ostream::flush();
        if (0 < (int)uVar11) {
          lVar6 = 0;
          do {
            TPZCompElSide::Reference
                      (&local_a8,(TPZCompElSide *)((long)(TPZCompEl **)local_168._8_8_ + lVar6));
            iVar3 = TPZGeoElSide::Dimension(&local_a8);
            if (iVar3 == this->fDimension) {
              (**(code **)(*(long *)&this_02->super_TPZCompMesh + 200))
                        (this_02,mesh,
                         *(undefined8 *)
                          (*(long *)((long)(TPZCompEl **)local_168._8_8_ + lVar6) + 0x10));
            }
            lVar6 = lVar6 + 0x10;
          } while ((ulong)uVar11 << 4 != lVar6);
        }
        (**(code **)(*(long *)&this_02->super_TPZCompMesh + 0x60))(this_02);
        uVar12 = local_180;
        this_03 = local_188;
        if ((TPZCompElSide *)local_168._8_8_ == local_148) {
          local_168._8_8_ = (TPZCompElSide *)0x0;
        }
        local_168._24_8_ = 0;
        local_168._0_8_ = local_190;
        if ((TPZCompElSide *)local_168._8_8_ != (TPZCompElSide *)0x0) {
          operator_delete__((void *)local_168._8_8_);
        }
      }
      nelem = nelem + 1;
    } while (nelem != uVar12);
  }
  TPZSimpleTimer::ReturnTimeString_abi_cxx11_((string *)local_168,&local_90);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)local_168._0_8_,local_168._8_8_);
  if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
    operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
  }
  uVar11 = (uint)(((this->fCMesh).fRef)->fPointer->fElementVec).
                 super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  if ((int)uVar11 < 1) {
    pTVar10 = (TPZCompEl *)0x0;
  }
  else {
    pTVar10 = (TPZCompEl *)0x0;
    lVar6 = 0;
    do {
      ppTVar7 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(((this->fCMesh).fRef)->fPointer->fElementVec).
                            super_TPZChunkVector<TPZCompEl_*,_10>,lVar6);
      pTVar1 = *ppTVar7;
      if (pTVar1 == (TPZCompEl *)0x0) {
        bVar13 = false;
      }
      else {
        iVar3 = (**(code **)(*(long *)pTVar1 + 0xb0))(pTVar1);
        bVar13 = iVar3 == 0;
        if (bVar13) {
          pTVar10 = pTVar1;
        }
      }
    } while ((!bVar13) &&
            (bVar13 = (ulong)(uVar11 & 0x7fffffff) - 1 != lVar6, lVar6 = lVar6 + 1, bVar13));
  }
  if (pTVar10 != (TPZCompEl *)0x0) {
    iVar3 = (**(code **)(*(long *)pTVar10 + 0xa0))(pTVar10,0);
    if (0 < (int)uVar11) {
      uVar12 = 0;
      do {
        ppTVar7 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                            (&(((this->fCMesh).fRef)->fPointer->fElementVec).
                              super_TPZChunkVector<TPZCompEl_*,_10>,uVar12);
        if ((*ppTVar7 == (TPZCompEl *)0x0) ||
           (plVar8 = (long *)__dynamic_cast(*ppTVar7,&TPZCompEl::typeinfo,&TPZSubCompMesh::typeinfo,
                                            0x918), plVar8 == (long *)0x0)) {
          bVar13 = false;
        }
        else {
          iVar4 = (**(code **)(*plVar8 + 0x180))(plVar8);
          if (0 < iVar4) {
            iVar9 = 0;
            do {
              lVar6 = (**(code **)(*plVar8 + 0x178))(plVar8,iVar9);
              if (lVar6 == iVar3) {
                (**(code **)(*plVar8 + 200))(plVar8,((this->fCMesh).fRef)->fPointer,pTVar10->fIndex)
                ;
                iVar3 = -1;
                pTVar10 = (TPZCompEl *)0x0;
                break;
              }
              iVar9 = iVar9 + 1;
            } while (iVar4 != iVar9);
          }
          bVar13 = pTVar10 == (TPZCompEl *)0x0;
        }
      } while ((!bVar13) && (uVar12 = uVar12 + 1, uVar12 != (uVar11 & 0x7fffffff)));
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Making Internal",0xf);
  iVar2 = (((this->fCMesh).fRef)->fPointer->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.
          fNElements;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Make all Internal \n",0x13);
  TPZSimpleTimer::TPZSimpleTimer((TPZSimpleTimer *)local_168);
  (**(code **)(*(long *)((this->fCMesh).fRef)->fPointer + 0x78))();
  uVar11 = (uint)iVar2;
  if (0 < (int)uVar11) {
    uVar12 = 0;
    do {
      ppTVar7 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(((this->fCMesh).fRef)->fPointer->fElementVec).
                            super_TPZChunkVector<TPZCompEl_*,_10>,uVar12);
      if ((*ppTVar7 != (TPZCompEl *)0x0) &&
         (plVar8 = (long *)__dynamic_cast(*ppTVar7,&TPZCompEl::typeinfo,&TPZSubCompMesh::typeinfo,
                                          0x918), plVar8 != (long *)0x0)) {
        local_1b0._M_dataplus._M_p._0_1_ = 0x2d;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)&local_1b0,1);
        std::ostream::flush();
        (**(code **)(*plVar8 + 0xa8))(plVar8);
      }
      uVar12 = uVar12 + 1;
    } while ((uVar11 & 0x7fffffff) != uVar12);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," == Finished\n",0xd);
  (**(code **)(*(long *)((this->fCMesh).fRef)->fPointer + 0x88))();
  TPZSimpleTimer::ReturnTimeString_abi_cxx11_(&local_1b0,(TPZSimpleTimer *)local_168);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,
                    CONCAT44(local_1b0.field_2._M_allocated_capacity._4_4_,
                             local_1b0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  TPZSimpleTimer::~TPZSimpleTimer((TPZSimpleTimer *)local_168);
  TPZSimpleTimer::~TPZSimpleTimer(&local_90);
  return;
}

Assistant:

void TPZGenSubStruct::SubStructure()
{
	TPZSimpleTimer timesubstructuring; // init of timer for substructuring mesh
	
	TPZGeoMesh *gmesh = fCMesh->Reference();
	int nel = gmesh->NElements();
	int iel;
	for(iel=0; iel<nel; iel++)
	{
		TPZGeoEl *gel = gmesh->ElementVec()[iel];
		if(gel->Level() == this->fSubstructLevel)
		{
			TPZStack<TPZCompElSide> subels;
			TPZGeoElSide gelside(gel,gel->NSides()-1);
			gmesh->ResetReference();
			fCMesh->LoadReferences();
			gelside.HigherLevelCompElementList2(subels,0,0);
			int nelstack = subels.NElements();
			if(!nelstack)
			{
				TPZCompElSide celside = gelside.Reference();
				if(celside.Element()) 
				{
					subels.Push(celside);
					nelstack = 1;
				}
			}
			TPZCompMesh *cmesh = fCMesh.operator->();
			TPZSubCompMesh *submesh = new TPZSubCompMesh(*cmesh);
			std::cout << '*';
			std::cout.flush();
			int sub;
			for(sub=0; sub<nelstack; sub++)
			{
				if(subels[sub].Reference().Dimension() == fDimension)
				{
					submesh->TransferElement(cmesh,subels[sub].Element()->Index());
#ifdef PZDEBUG 
					submesh->VerifyDatastructureConsistency();
#endif
				}
			}
			submesh->ExpandSolution();
		}
	}
	
	std::cout << timesubstructuring.ReturnTimeString(); // end of timer for substructuring mesh
	
	// transfer the point load
	// find the point elements
	nel = fCMesh->NElements();
	TPZCompEl *celpoint = 0;
	for(iel=0; iel<nel; iel++)
	{
		TPZCompEl *cel = fCMesh->ElementVec()[iel];
		if(!cel) continue;
		if(cel->Dimension() == 0) 
		{
			celpoint = cel;
			break;
		}
	}
	if(celpoint)
	{
		int conindex = celpoint->ConnectIndex(0);
		for(iel=0; iel<nel; iel++)
		{
			TPZCompEl *cel = fCMesh->ElementVec()[iel];
			if(!cel) continue;
			TPZSubCompMesh *submesh = dynamic_cast<TPZSubCompMesh *>(cel);
			if(!submesh) continue;
			int nc = submesh->NConnects();
			int ic;
			for(ic=0; ic<nc; ic++)
			{
				if(submesh->ConnectIndex(ic) == conindex)
				{
					submesh->TransferElement(fCMesh.operator->(),celpoint->Index());
					celpoint = 0;
					conindex = -1;
					break;
				}
			}
			if(!celpoint) break;
		}
	}
	
	//#define MAKEINTERNAL
#ifdef MAKEINTERNAL
	std::cout << "Making Internal";
	// make all nodes internal
	nel = fCMesh->NElements();
	
	std::cout << "Make all Internal \n";
	TPZSimpleTimer timeformakeallinternal; // init for timer
	fCMesh->ComputeNodElCon();
	for(iel=0; iel<nel; iel++)
	{
		TPZCompEl *cel = fCMesh->ElementVec()[iel];
		if(!cel) continue;
		TPZSubCompMesh *submesh = dynamic_cast<TPZSubCompMesh *>(cel);
		if(!submesh) continue;
		std::cout << '-'; std::cout.flush();
		submesh->MakeAllInternal();
	}
	std::cout << " == Finished\n";
	fCMesh->CleanUpUnconnectedNodes();
	
	std::cout << timeformakeallinternal.ReturnTimeString();
#endif
}